

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
cfgfile::details::parser_base_t<cfgfile::qstring_trait_t>::check_parser_state_after_parsing
          (parser_base_t<cfgfile::qstring_trait_t> *this)

{
  bool bVar1;
  _Elt_pointer pptVar2;
  exception_t<cfgfile::qstring_trait_t> *peVar3;
  allocator<char> local_d2;
  allocator<char> local_d1;
  string_t local_d0;
  string_t local_b8;
  qstring_wrapper_t local_a0;
  string local_88;
  string local_68;
  qstring_wrapper_t local_48;
  qstring_wrapper_t local_30;
  
  if ((this->m_stack).c.
      super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->m_stack).c.
      super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    peVar3 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Unexpected end of file. Still unfinished tag \"",&local_d1);
    qstring_trait_t::from_ascii(&local_b8,&local_68);
    pptVar2 = (this->m_stack).c.
              super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar2 ==
        (this->m_stack).c.
        super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pptVar2 = (this->m_stack).c.
                super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    operator+(&local_a0,&local_b8,&pptVar2[-1]->m_name);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"\".",&local_d2);
    qstring_trait_t::from_ascii(&local_d0,&local_88);
    operator+(&local_30,&local_a0,&local_d0);
    exception_t<cfgfile::qstring_trait_t>::exception_t(peVar3,&local_30);
    __cxa_throw(peVar3,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  if (this->m_tag->m_is_mandatory == true) {
    bVar1 = tag_t<cfgfile::qstring_trait_t>::is_defined(this->m_tag);
    if (!bVar1) {
      peVar3 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Undefined mandatory tag: \"",&local_d1);
      qstring_trait_t::from_ascii(&local_b8,&local_68);
      operator+(&local_a0,&local_b8,&this->m_tag->m_name);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"\".",&local_d2);
      qstring_trait_t::from_ascii(&local_d0,&local_88);
      operator+(&local_48,&local_a0,&local_d0);
      exception_t<cfgfile::qstring_trait_t>::exception_t(peVar3,&local_48);
      __cxa_throw(peVar3,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                  exception_t<cfgfile::qstring_trait_t>::~exception_t);
    }
  }
  return;
}

Assistant:

void check_parser_state_after_parsing()
	{
		if( !m_stack.empty() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"Still unfinished tag \"" ) + m_stack.top()->name() +
				Trait::from_ascii( "\"." ) );

		if( m_tag.is_mandatory() && !m_tag.is_defined() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined mandatory tag: \"" ) +
				m_tag.name() + Trait::from_ascii( "\"." ) );
	}